

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  uint local_40;
  uint local_3c;
  GLuint c_1;
  GLuint c;
  GLint64 i64;
  GLint *pGStack_28;
  GLint i;
  GLint *min_values_local;
  BasicMax *pBStack_18;
  GLenum target_local;
  BasicMax *this_local;
  
  pGStack_28 = min_values;
  min_values_local._4_4_ = target;
  pBStack_18 = this;
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,local_3c,(GLint *)((long)&i64 + 4));
    if ((int)i64._4_4_ < pGStack_28[local_3c]) {
      anon_unknown_0::Output
                ("Is %d should be at least %d.\n",(ulong)i64._4_4_,(ulong)(uint)pGStack_28[local_3c]
                );
      return false;
    }
  }
  local_40 = 0;
  while( true ) {
    if (2 < local_40) {
      return true;
    }
    glu::CallLogWrapper::glGetInteger64i_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,min_values_local._4_4_,local_40,(GLint64 *)&c_1);
    if ((int)_c_1 < pGStack_28[local_40]) break;
    local_40 = local_40 + 1;
  }
  anon_unknown_0::Output
            ("Is %d should be at least %d.\n",_c_1 & 0xffffffff,(ulong)(uint)pGStack_28[local_40]);
  return false;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint   i;
		GLint64 i64;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (static_cast<GLint>(i64) < min_values[c])
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}

		return true;
	}